

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void globalInit(void)

{
  int fac;
  
  pc = 0;
  nkw = 0;
  numberVal = 0;
  currentSymbol = 0;
  currentCharacter = '\0';
  intTypeIndex = 0;
  charTypeIndex = 0;
  currentLevel = 0;
  lineNumber = 1;
  procFixList = (procFixStruct *)0x0;
  terminate = 0;
  bigNum = 0x10000;
  RISC_MEMSIZE = 32000;
  firstInstr = (instrStruct *)calloc(1,0x10);
  firstInstr->instr = 0;
  firstInstr->next = (instrStruct *)0x0;
  lastInstr = firstInstr;
  setupRegister();
  return;
}

Assistant:

procedure
void globalInit(void) {
	variable int fac;
	fac = 4; pc = 0; nkw = 0; numberVal = 0; currentSymbol = 0;
	currentCharacter = '\0'; intTypeIndex = 0; charTypeIndex = 0;
	currentLevel = 0; lineNumber = 1; procFixList = NULL; terminate = false;
	bigNum = 16384 * fac; RISC_MEMSIZE = 32000;
	allocMem(firstInstr);
	firstInstr->instr = 0;
	firstInstr->next = NULL;
	lastInstr = firstInstr;
	setupRegister(); 
}